

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O3

SinkNextBatchType __thiscall
duckdb::PipelineExecutor::NextBatch(PipelineExecutor *this,DataChunk *source_chunk)

{
  SourcePartitionInfo *this_00;
  PhysicalOperator *pPVar1;
  undefined8 params;
  int iVar2;
  type pGVar3;
  type pLVar4;
  pointer pLVar5;
  idx_t iVar6;
  InternalException *pIVar7;
  pointer pcVar8;
  SinkNextBatchType SVar9;
  optional_ptr<duckdb::PhysicalOperator,_true> *poVar10;
  OperatorSinkNextBatchInput next_batch_input;
  pointer local_98;
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> local_90;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  undefined1 local_58 [40];
  
  pcVar8 = (pointer)(this->pipeline->base_batch_index + 9999999999999);
  local_90.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = pcVar8;
  if (source_chunk->count != 0) {
    poVar10 = &this->pipeline->source;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar10);
    pPVar1 = poVar10->ptr;
    pGVar3 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator*(&this->pipeline->source_state);
    pLVar4 = unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
             ::operator*(&this->local_source_state);
    (*pPVar1->_vptr_PhysicalOperator[0x12])
              (local_78,pPVar1,&this->context,source_chunk,pGVar3,pLVar4,
               &this->required_partition_info);
    params = local_78._0_8_;
    local_58._16_8_ =
         local_90.
         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58._8_8_ =
         local_90.
         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58._0_8_ =
         local_90.
         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_90.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aStack_68._8_8_;
    local_90.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_78._8_8_;
    local_90.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)aStack_68._M_allocated_capacity;
    local_78._8_8_ = (pointer)0x0;
    aStack_68._M_allocated_capacity = 0;
    aStack_68._8_8_ = (pointer)0x0;
    ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::
    ~vector((vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *)
            local_58);
    local_98 = (pointer)(params + this->pipeline->base_batch_index + 1);
    if (pcVar8 <= local_98) {
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      local_58._0_8_ = local_58 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,
                 "Pipeline batch index - invalid batch index %llu returned by source operator","");
      InternalException::InternalException<unsigned_long>(pIVar7,(string *)local_58,params);
      __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::
    ~vector((vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *)
            (local_78 + 8));
  }
  pLVar5 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
           operator->(&this->local_sink_state);
  this_00 = &pLVar5->partition_info;
  pcVar8 = (pointer)optional_idx::GetIndex(&this_00->batch_index);
  if (local_98 != pcVar8) {
    pcVar8 = (pointer)optional_idx::GetIndex(&this_00->batch_index);
    if (local_98 < pcVar8) {
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      local_78._0_8_ = &aStack_68;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,
                 "Pipeline batch index - gotten lower batch index %llu (down from previous batch index of %llu)"
                 ,"");
      iVar6 = optional_idx::GetIndex(&this_00->batch_index);
      InternalException::InternalException<unsigned_long,unsigned_long>
                (pIVar7,(string *)local_78,(unsigned_long)local_98,iVar6);
      __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar6 = optional_idx::GetIndex(&this_00->batch_index);
    optional_idx::optional_idx((optional_idx *)local_78,(idx_t)local_98);
    (pLVar5->partition_info).batch_index.index = local_78._0_8_;
    aStack_68._M_allocated_capacity =
         (size_type)
         (pLVar5->partition_info).partition_data.
         super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78._0_8_ =
         (pLVar5->partition_info).partition_data.
         super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_78._8_8_ =
         (pLVar5->partition_info).partition_data.
         super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pLVar5->partition_info).partition_data.
    super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_90.
         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pLVar5->partition_info).partition_data.
    super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_90.
         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pLVar5->partition_info).partition_data.
    super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_90.
         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_90.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::
    ~vector((vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *)
            local_78);
    poVar10 = &this->pipeline->sink;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar10);
    local_78._0_8_ =
         unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
         operator*(&poVar10->ptr->sink_state);
    local_78._8_8_ =
         unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
         operator*(&this->local_sink_state);
    aStack_68._M_allocated_capacity = (size_type)&this->interrupt_state;
    poVar10 = &this->pipeline->sink;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar10);
    pPVar1 = poVar10->ptr;
    iVar2 = (*pPVar1->_vptr_PhysicalOperator[0x1e])(pPVar1,&this->context,local_78);
    if ((char)iVar2 == '\x01') {
      optional_idx::optional_idx((optional_idx *)local_58,iVar6);
      (this_00->batch_index).index = local_58._0_8_;
      SVar9 = BLOCKED;
      goto LAB_0054bad7;
    }
    iVar6 = Pipeline::UpdateBatchIndex(this->pipeline,iVar6,(idx_t)local_98);
    optional_idx::optional_idx((optional_idx *)local_58,iVar6);
    (pLVar5->partition_info).min_batch_index.index = local_58._0_8_;
  }
  SVar9 = READY;
LAB_0054bad7:
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&local_90);
  return SVar9;
}

Assistant:

SinkNextBatchType PipelineExecutor::NextBatch(DataChunk &source_chunk) {
	D_ASSERT(required_partition_info.AnyRequired());
	auto max_batch_index = pipeline.base_batch_index + PipelineBuildState::BATCH_INCREMENT - 1;
	// by default set it to the maximum valid batch index value for the current pipeline
	OperatorPartitionData next_data(max_batch_index);
	if (source_chunk.size() > 0) {
		// if we retrieved data - initialize the next batch index
		auto partition_data = pipeline.source->GetPartitionData(context, source_chunk, *pipeline.source_state,
		                                                        *local_source_state, required_partition_info);
		auto batch_index = partition_data.batch_index;
		// we start with the base_batch_index as a valid starting value. Make sure that next batch is called below
		next_data = std::move(partition_data);
		next_data.batch_index = pipeline.base_batch_index + batch_index + 1;
		if (next_data.batch_index >= max_batch_index) {
			throw InternalException("Pipeline batch index - invalid batch index %llu returned by source operator",
			                        batch_index);
		}
	}
	auto &partition_info = local_sink_state->partition_info;
	if (next_data.batch_index == partition_info.batch_index.GetIndex()) {
		// no changes, return
		return SinkNextBatchType::READY;
	}
	// batch index has changed - update it
	if (partition_info.batch_index.GetIndex() > next_data.batch_index) {
		throw InternalException(
		    "Pipeline batch index - gotten lower batch index %llu (down from previous batch index of %llu)",
		    next_data.batch_index, partition_info.batch_index.GetIndex());
	}
#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
	if (debug_blocked_next_batch_count < debug_blocked_target_count) {
		debug_blocked_next_batch_count++;

		auto &callback_state = interrupt_state;
		std::thread rewake_thread([callback_state] {
			std::this_thread::sleep_for(std::chrono::milliseconds(1));
			callback_state.Callback();
		});
		rewake_thread.detach();

		return SinkNextBatchType::BLOCKED;
	}
#endif
	auto current_batch = partition_info.batch_index.GetIndex();
	partition_info.batch_index = next_data.batch_index;
	partition_info.partition_data = std::move(next_data.partition_data);
	OperatorSinkNextBatchInput next_batch_input {*pipeline.sink->sink_state, *local_sink_state, interrupt_state};
	// call NextBatch before updating min_batch_index to provide the opportunity to flush the previous batch
	auto next_batch_result = pipeline.sink->NextBatch(context, next_batch_input);

	if (next_batch_result == SinkNextBatchType::BLOCKED) {
		partition_info.batch_index = current_batch; // set batch_index back to what it was before
		return SinkNextBatchType::BLOCKED;
	}

	partition_info.min_batch_index = pipeline.UpdateBatchIndex(current_batch, next_data.batch_index);

	return SinkNextBatchType::READY;
}